

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracer.cpp
# Opt level: O1

void __thiscall
PathTracer::CmdRender(PathTracer *this,shared_ptr<myvk::CommandBuffer> *command_buffer)

{
  CommandBuffer *pCVar1;
  element_type *peVar2;
  pointer psVar3;
  element_type *peVar4;
  element_type *peVar5;
  long lVar6;
  initializer_list<std::shared_ptr<myvk::DescriptorSet>_> __l;
  uint32_t uint_push_constants [2];
  vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> local_e8;
  uint32_t local_d0;
  LightTypes local_cc;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> local_c8;
  undefined1 local_a8 [8];
  undefined8 local_a0;
  float local_98;
  element_type *peStack_90;
  vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar2 = (this->m_octree_ptr).super___shared_ptr<Octree,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_88.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(peVar2->m_descriptor_set).
                super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_88.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(peVar2->m_descriptor_set).
                super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  if (local_88.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(local_88.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>.
                _M_impl.super__Vector_impl_data._M_finish)->pNext =
           *(int *)&(local_88.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>.
                     _M_impl.super__Vector_impl_data._M_finish)->pNext + 1;
      UNLOCK();
    }
    else {
      *(int *)&(local_88.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>.
                _M_impl.super__Vector_impl_data._M_finish)->pNext =
           *(int *)&(local_88.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>.
                     _M_impl.super__Vector_impl_data._M_finish)->pNext + 1;
    }
  }
  psVar3 = (((this->m_camera_ptr).super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_descriptor_sets).
           super__Vector_base<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_88.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       *(pointer *)&psVar3[3].super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>;
  local_70 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(psVar3 + 3) + 8);
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_70->_M_use_count = local_70->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_70->_M_use_count = local_70->_M_use_count + 1;
    }
  }
  peVar4 = (((this->m_lighting_ptr).super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->m_environment_map_ptr).super___shared_ptr<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_68 = (peVar4->m_descriptor_set).
             super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_60 = (peVar4->m_descriptor_set).
             super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_60->_M_use_count = local_60->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_60->_M_use_count = local_60->_M_use_count + 1;
    }
  }
  local_58 = (this->m_sobol).m_descriptor_set.
             super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_50 = (this->m_sobol).m_descriptor_set.
             super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_50->_M_use_count = local_50->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_50->_M_use_count = local_50->_M_use_count + 1;
    }
  }
  local_48 = (this->m_target_descriptor_set).
             super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40 = (this->m_target_descriptor_set).
             super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_40->_M_use_count = local_40->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_40->_M_use_count = local_40->_M_use_count + 1;
    }
  }
  local_38 = (this->m_noise_descriptor_set).
             super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_30 = (this->m_noise_descriptor_set).
             super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_30->_M_use_count = local_30->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_30->_M_use_count = local_30->_M_use_count + 1;
    }
  }
  __l._M_len = 6;
  __l._M_array = (iterator)&local_88;
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
            *)&local_c8,__l,(allocator_type *)&local_d0);
  local_a8 = (undefined1  [8])
             (this->m_pipeline).
             super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_a0 = (this->m_pipeline).
             super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_a0->_M_use_count = local_a0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_a0->_M_use_count = local_a0->_M_use_count + 1;
    }
  }
  local_e8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::CommandBuffer::CmdBindDescriptorSets
            (pCVar1,(vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
                     *)&local_c8,(Ptr<PipelineBase> *)local_a8,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e8);
  if (local_e8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
             *)&local_c8);
  lVar6 = 0x60;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&peStack_90 + lVar6) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&peStack_90 + lVar6));
    }
    lVar6 = lVar6 + -0x10;
  } while (lVar6 != 0);
  local_d0 = this->m_bounce;
  peVar5 = (this->m_lighting_ptr).super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_cc = peVar5->m_light_type;
  if ((local_cc == kEnvironmentMap) &&
     ((((peVar5->m_environment_map_ptr).
        super___shared_ptr<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_hdr_image).
      super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0)) {
    local_cc = kConstantColor;
  }
  local_a8 = *(undefined1 (*) [8])&peVar5->m_sun_radiance;
  peVar4 = (peVar5->m_environment_map_ptr).
           super___shared_ptr<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_a0._4_4_ = peVar4->m_rotation;
  local_a0._0_4_ = (peVar5->m_sun_radiance).field_2;
  local_98 = peVar4->m_multiplier;
  myvk::CommandBuffer::CmdPushConstants
            ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,&this->m_pipeline_layout,0x20,0,8,&local_d0);
  myvk::CommandBuffer::CmdPushConstants
            ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,&this->m_pipeline_layout,0x20,8,0x14,local_a8);
  pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_88.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(this->m_pipeline).
                super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_88.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(this->m_pipeline).
                super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  if (local_88.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(local_88.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>.
                _M_impl.super__Vector_impl_data._M_finish)->pNext =
           *(int *)&(local_88.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>.
                     _M_impl.super__Vector_impl_data._M_finish)->pNext + 1;
      UNLOCK();
    }
    else {
      *(int *)&(local_88.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>.
                _M_impl.super__Vector_impl_data._M_finish)->pNext =
           *(int *)&(local_88.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>.
                     _M_impl.super__Vector_impl_data._M_finish)->pNext + 1;
    }
  }
  myvk::CommandBuffer::CmdBindPipeline(pCVar1,(Ptr<PipelineBase> *)&local_88);
  if (local_88.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_88.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  }
  myvk::CommandBuffer::CmdDispatch
            ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,((this->m_width >> 3) + 1) - (uint)((this->m_width & 7) == 0),
             ((this->m_height >> 3) + 1) - (uint)((this->m_height & 7) == 0),1);
  local_88.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  myvk::CommandBuffer::CmdPipelineBarrier
            ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,0x800,0x800,&local_88,&local_c8,&local_e8);
  if (local_e8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  Sobol::CmdNext(&this->m_sobol,command_buffer);
  return;
}

Assistant:

void PathTracer::CmdRender(const std::shared_ptr<myvk::CommandBuffer> &command_buffer) {
	command_buffer->CmdBindDescriptorSets({m_octree_ptr->GetDescriptorSet(),
	                                       m_camera_ptr->GetFrameDescriptorSet(kFrameCount),
	                                       m_lighting_ptr->GetEnvironmentMapPtr()->GetDescriptorSet(),
	                                       m_sobol.GetDescriptorSet(), m_target_descriptor_set, m_noise_descriptor_set},
	                                      m_pipeline);

	uint32_t uint_push_constants[] = {m_bounce, (uint32_t)m_lighting_ptr->GetFinalLightType()};
	float float_push_constants[] = {
	    m_lighting_ptr->m_sun_radiance.x, m_lighting_ptr->m_sun_radiance.y, m_lighting_ptr->m_sun_radiance.z,
	    m_lighting_ptr->GetEnvironmentMapPtr()->m_rotation, m_lighting_ptr->GetEnvironmentMapPtr()->m_multiplier};

	command_buffer->CmdPushConstants(m_pipeline_layout, VK_SHADER_STAGE_COMPUTE_BIT, 0, sizeof(uint_push_constants),
	                                 uint_push_constants);
	command_buffer->CmdPushConstants(m_pipeline_layout, VK_SHADER_STAGE_COMPUTE_BIT, sizeof(uint_push_constants),
	                                 sizeof(float_push_constants), float_push_constants);
	command_buffer->CmdBindPipeline(m_pipeline);
	command_buffer->CmdDispatch(group_8(m_width), group_8(m_height), 1);

	command_buffer->CmdPipelineBarrier(VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, {},
	                                   {}, {});

	m_sobol.CmdNext(command_buffer);
}